

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O3

string * __thiscall
s2textformat::ToString_abi_cxx11_
          (string *__return_storage_ptr__,s2textformat *this,
          vector<S2LatLng,_std::allocator<S2LatLng>_> *latlngs)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar1 = *(long *)this;
  if (*(long *)(this + 8) != lVar1) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      if (lVar2 != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        lVar1 = *(long *)this;
      }
      StringAppendF(__return_storage_ptr__,"%.15g:%.15g",
                    *(double *)(lVar1 + lVar2) * 57.29577951308232,
                    *(double *)(lVar1 + 8 + lVar2) * 57.29577951308232);
      uVar3 = uVar3 + 1;
      lVar1 = *(long *)this;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < (ulong)(*(long *)(this + 8) - lVar1 >> 4));
  }
  return __return_storage_ptr__;
}

Assistant:

string ToString(const vector<S2LatLng>& latlngs) {
  string out;
  for (int i = 0; i < latlngs.size(); ++i) {
    if (i > 0) out += ", ";
    AppendVertex(latlngs[i], &out);
  }
  return out;
}